

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_distance_of_landscapes_on_grid.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  pointer pPVar3;
  value_type *__x;
  size_type sVar4;
  long lVar5;
  long lVar6;
  size_type __n;
  pointer pPVar7;
  size_t j;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  allocator_type local_2a9;
  double local_2a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  distance;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  landscaspes;
  value_type_conflict local_240;
  ofstream out;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_228;
  size_t sStack_210;
  size_t local_208;
  
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
                          );
  poVar2 = std::operator<<(poVar2,"be created beforehand).\n");
  poVar2 = std::operator<<(poVar2,
                           "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
                          );
  poVar2 = std::operator<<(poVar2,"maps. For L^infty distance choose p = -1. \n");
  std::operator<<(poVar2,
                  "The remaining parameters of this program are names of files with persistence landscapes on grid.\n"
                 );
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,
                    "Wrong number of parameters, the program will now terminate \n");
    iVar1 = 1;
  }
  else {
    iVar1 = atoi(argv[1]);
    if (iVar1 == -1) {
      local_2a8 = 1.79769313486232e+308;
    }
    else {
      local_2a8 = (double)iVar1;
    }
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar11 = (ulong)(uint)argc - 2;
    __x = argv + 2;
    while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&filenames,__x);
      __x = __x + 1;
    }
    landscaspes.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    landscaspes.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    landscaspes.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::reserve(&landscaspes,
              (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
    for (sVar4 = 0;
        sVar4 != (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3; sVar4 = sVar4 + 1) {
      local_228.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sStack_210 = 0;
      local_228.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _out = 0.0;
      local_208 = 0;
      Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
                ((Persistence_landscape_on_grid *)&out,
                 filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar4]);
      std::
      vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
      ::push_back(&landscaspes,(Persistence_landscape_on_grid *)&out);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_228);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&distance,sVar4,(allocator_type *)&out);
    lVar11 = 0;
    for (sVar4 = 0;
        __n = (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3, sVar4 != __n; sVar4 = sVar4 + 1)
    {
      local_240 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&out,__n,&local_240,&local_2a9);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((distance.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar11),
                 (vector<double,_std::allocator<double>_> *)&out);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&out);
      lVar11 = lVar11 + 0x18;
    }
    lVar10 = 0;
    lVar6 = 0;
    pPVar3 = landscaspes.
             super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar7 = landscaspes.
             super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar11 = 0; lVar5 = lVar6, lVar8 = lVar11, lVar9 = lVar10,
        lVar11 != ((long)pPVar3 - (long)pPVar7) / 0x38; lVar11 = lVar11 + 1) {
      for (; lVar8 != ((long)pPVar3 - (long)pPVar7) / 0x38; lVar8 = lVar8 + 1) {
        dVar13 = Gudhi::Persistence_representations::compute_distance_of_landscapes_on_grid
                           (pPVar7 + lVar11,
                            (Persistence_landscape_on_grid *)((long)&pPVar7->grid_min + lVar9),
                            local_2a8);
        *(double *)
         (*(long *)((long)&((distance.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5) + lVar11 * 8) = dVar13;
        distance.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar11].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar8] = dVar13;
        lVar5 = lVar5 + 0x18;
        lVar9 = lVar9 + 0x38;
        pPVar3 = landscaspes.
                 super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar7 = landscaspes.
                 super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar6 = lVar6 + 0x18;
      lVar10 = lVar10 + 0x38;
    }
    std::ofstream::ofstream(&out);
    std::ofstream::open((char *)&out,0x107481);
    dVar13 = 0.0;
    while( true ) {
      if (dVar13 == (double)(((long)distance.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)distance.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18)) break;
      local_2a8 = dVar13;
      for (lVar11 = 0;
          lVar11 != ((long)distance.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)distance.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar11 = lVar11 + 1) {
        poVar2 = std::ostream::_M_insert<double>
                           (distance.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)dVar13].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11]);
        std::operator<<(poVar2," ");
        poVar2 = std::ostream::_M_insert<double>
                           (distance.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)dVar13].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11]);
        std::operator<<(poVar2," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
      std::endl<char,std::char_traits<char>>((ostream *)&out);
      dVar13 = (double)((long)local_2a8 + 1);
    }
    std::ofstream::close();
    std::operator<<((ostream *)&std::clog,"Distance can be found in \'distance.g_land\' file\n");
    std::ofstream::~ofstream(&out);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&distance);
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::~vector(&landscaspes);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
            << "be created beforehand).\n"
            << "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
            << "maps. For L^infty distance choose p = -1. \n"
            << "The remaining parameters of this program are names of files with persistence landscapes on grid.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  int pp = atoi(argv[1]);
  double p = std::numeric_limits<double>::max();
  if (pp != -1) {
    p = pp;
  }

  std::vector<const char*> filenames;
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Persistence_landscape_on_grid> landscaspes;
  landscaspes.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Persistence_landscape_on_grid l;
    l.load_landscape_from_file(filenames[file_no]);
    landscaspes.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > distance(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    distance[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != landscaspes.size(); ++i) {
    for (size_t j = i; j != landscaspes.size(); ++j) {
      distance[i][j] = distance[j][i] = compute_distance_of_landscapes_on_grid(landscaspes[i], landscaspes[j], p);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("distance.g_land");
  for (size_t i = 0; i != distance.size(); ++i) {
    for (size_t j = 0; j != distance.size(); ++j) {
      std::clog << distance[i][j] << " ";
      out << distance[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'distance.g_land' file\n";
  return 0;
}